

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O3

Var __thiscall Glucose::Solver::newVar(Solver *this,bool sign,bool dvar)

{
  vec<char> *pvVar1;
  unsigned_long *puVar2;
  char cVar3;
  int iVar4;
  char *pcVar5;
  long lVar6;
  long lVar7;
  undefined7 in_register_00000011;
  undefined7 in_register_00000031;
  int size;
  int size_00;
  double dVar8;
  VarData local_48;
  undefined4 local_40;
  undefined4 local_3c;
  long local_38;
  
  local_3c = (undefined4)CONCAT71(in_register_00000011,dvar);
  local_40 = (undefined4)CONCAT71(in_register_00000031,sign);
  iVar4 = (this->vardata).sz;
  size = iVar4 * 2 + 1;
  vec<Glucose::vec<Glucose::Solver::Watcher>_>::growTo(&(this->watches).occs,size);
  pvVar1 = &(this->watches).dirty;
  local_48 = (VarData)((ulong)local_48 & 0xffffffffffffff00);
  vec<char>::growTo(pvVar1,size,(char *)&local_48);
  size_00 = iVar4 * 2 + 2;
  local_38 = (long)iVar4;
  vec<Glucose::vec<Glucose::Solver::Watcher>_>::growTo(&(this->watches).occs,size_00);
  local_48 = (VarData)((ulong)local_48 & 0xffffffffffffff00);
  vec<char>::growTo(pvVar1,size_00,(char *)&local_48);
  vec<Glucose::vec<Glucose::Solver::Watcher>_>::growTo(&(this->watchesBin).occs,size);
  pvVar1 = &(this->watchesBin).dirty;
  local_48 = (VarData)((ulong)local_48 & 0xffffffffffffff00);
  vec<char>::growTo(pvVar1,size,(char *)&local_48);
  vec<Glucose::vec<Glucose::Solver::Watcher>_>::growTo(&(this->watchesBin).occs,size_00);
  local_48 = (VarData)((ulong)local_48 & 0xffffffffffffff00);
  vec<char>::growTo(pvVar1,size_00,(char *)&local_48);
  vec<Glucose::vec<Glucose::Solver::Watcher>_>::growTo(&(this->unaryWatches).occs,size);
  pvVar1 = &(this->unaryWatches).dirty;
  local_48 = (VarData)((ulong)local_48 & 0xffffffffffffff00);
  vec<char>::growTo(pvVar1,size,(char *)&local_48);
  vec<Glucose::vec<Glucose::Solver::Watcher>_>::growTo(&(this->unaryWatches).occs,size_00);
  local_48 = (VarData)((ulong)local_48 & 0xffffffffffffff00);
  vec<char>::growTo(pvVar1,size_00,(char *)&local_48);
  local_48.reason._0_1_ = 2;
  vec<Glucose::lbool>::push(&this->assigns,(lbool *)&local_48);
  local_48.reason = 0xffffffff;
  local_48.level = 0;
  vec<Glucose::Solver::VarData>::push(&this->vardata,&local_48);
  local_48.reason = 0;
  local_48.level = 0;
  if (this->rnd_init_act == true) {
    dVar8 = this->random_seed * 1389796.0;
    dVar8 = dVar8 - (double)(int)(dVar8 / 2147483647.0) * 2147483647.0;
    this->random_seed = dVar8;
    local_48 = (VarData)((dVar8 / 2147483647.0) * 1e-05);
  }
  vec<double>::push(&this->activity,(double *)&local_48);
  local_48 = (VarData)((ulong)local_48 & 0xffffffffffffff00);
  vec<char>::push(&this->seen,(char *)&local_48);
  local_48 = (VarData)((ulong)local_48 & 0xffffffff00000000);
  vec<unsigned_int>::push(&this->permDiff,&local_48.reason);
  local_48.reason._0_1_ = (char)local_40;
  vec<char>::push(&this->polarity,(char *)&local_48);
  local_48 = (VarData)((ulong)(uint7)local_48._1_7_ << 8);
  vec<char>::push(&this->forceUNSAT,(char *)&local_48);
  vec<char>::push(&this->decision);
  lVar6 = local_38;
  iVar4 = (int)local_38;
  vec<Glucose::Lit>::capacity(&this->trail,iVar4 + 1);
  pcVar5 = (this->decision).data;
  cVar3 = pcVar5[lVar6];
  if ((char)local_3c == '\0') {
    lVar7 = -1;
    if (cVar3 == '\0') goto LAB_001115ac;
  }
  else {
    if (cVar3 != '\0') goto LAB_001115ac;
    lVar7 = 1;
  }
  puVar2 = (this->stats).data + 0x12;
  *puVar2 = *puVar2 + lVar7;
LAB_001115ac:
  pcVar5[lVar6] = (char)local_3c;
  if ((((this->order_heap).indices.sz <= iVar4) || ((this->order_heap).indices.data[lVar6] < 0)) &&
     ((this->decision).data[lVar6] != '\0')) {
    Heap<Glucose::Solver::VarOrderLt>::insert(&this->order_heap,iVar4);
  }
  return iVar4;
}

Assistant:

Var Solver::newVar(bool sign, bool dvar) {
    int v = nVars();
    watches.init(mkLit(v, false));
    watches.init(mkLit(v, true));
    watchesBin.init(mkLit(v, false));
    watchesBin.init(mkLit(v, true));
    unaryWatches.init(mkLit(v, false));
    unaryWatches.init(mkLit(v, true));
    assigns.push(l_Undef);
    vardata.push(mkVarData(CRef_Undef, 0));
    activity.push(rnd_init_act ? drand(random_seed) * 0.00001 : 0);
    seen.push(0);
    permDiff.push(0);
    polarity.push(sign);
    forceUNSAT.push(0);
    decision.push();
    trail.capacity(v + 1);
    setDecisionVar(v, dvar);
    return v;
}